

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Type __thiscall wasm::TranslateToFuzzReader::getReferenceType(TranslateToFuzzReader *this)

{
  bool bVar1;
  value_type *pvVar2;
  FeatureOptions<wasm::Type> *pFVar3;
  HeapType local_180;
  Type local_178;
  HeapType local_170;
  Type local_168;
  FeatureSet local_15c;
  HeapType local_158;
  Type local_150;
  HeapType local_148;
  Type local_140;
  HeapType local_138;
  Type local_130;
  HeapType local_128;
  Type local_120;
  HeapType local_118;
  Type local_110;
  HeapType local_108;
  Type local_100;
  HeapType local_f8;
  Type local_f0;
  HeapType local_e8;
  Type local_e0;
  HeapType local_d8;
  Type local_d0;
  HeapType local_c8;
  Type local_c0;
  FeatureSet local_b4;
  HeapType local_b0;
  Type local_a8 [3];
  FeatureSet local_8c;
  FeatureOptions<wasm::Type> local_88;
  uintptr_t local_50;
  Nullability local_44;
  HeapType HStack_40;
  Nullability nullability;
  value_type heapType;
  TranslateToFuzzReader *this_local;
  
  heapType.id = (uintptr_t)this;
  bVar1 = FeatureSet::hasReferenceTypes((FeatureSet *)(this->wasm + 0x178));
  if (((!bVar1) ||
      (bVar1 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::empty
                         (&this->interestingHeapTypes), bVar1)) || (bVar1 = oneIn(this,2), !bVar1))
  {
    local_88.options._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_88.options._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_88.options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_88.options._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_88.options._M_t._M_impl._0_8_ = 0;
    local_88.options._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_88.options._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    Random::FeatureOptions<wasm::Type>::FeatureOptions(&local_88);
    FeatureSet::FeatureSet(&local_8c,0x100);
    HeapType::HeapType(&local_b0,func);
    Type::Type(local_a8,local_b0,Nullable,Inexact);
    pFVar3 = Random::FeatureOptions<wasm::Type>::add<>(&local_88,local_8c,local_a8[0]);
    FeatureSet::FeatureSet(&local_b4,0x500);
    HeapType::HeapType(&local_c8,func);
    Type::Type(&local_c0,local_c8,NonNullable,Inexact);
    HeapType::HeapType(&local_d8,any);
    Type::Type(&local_d0,local_d8,NonNullable,Inexact);
    HeapType::HeapType(&local_e8,eq);
    Type::Type(&local_e0,local_e8,Nullable,Inexact);
    HeapType::HeapType(&local_f8,eq);
    Type::Type(&local_f0,local_f8,NonNullable,Inexact);
    HeapType::HeapType(&local_108,i31);
    Type::Type(&local_100,local_108,Nullable,Inexact);
    HeapType::HeapType(&local_118,i31);
    Type::Type(&local_110,local_118,NonNullable,Inexact);
    HeapType::HeapType(&local_128,struct_);
    Type::Type(&local_120,local_128,Nullable,Inexact);
    HeapType::HeapType(&local_138,struct_);
    Type::Type(&local_130,local_138,NonNullable,Inexact);
    HeapType::HeapType(&local_148,array);
    Type::Type(&local_140,local_148,Nullable,Inexact);
    HeapType::HeapType(&local_158,array);
    Type::Type(&local_150,local_158,NonNullable,Inexact);
    pFVar3 = Random::FeatureOptions<wasm::Type>::
             add<wasm::Type,wasm::Type,wasm::Type,wasm::Type,wasm::Type,wasm::Type,wasm::Type,wasm::Type,wasm::Type>
                       (pFVar3,local_b4,local_c0,local_d0,local_e0,local_f0,local_100,local_110,
                        local_120,local_130,local_140,local_150);
    FeatureSet::FeatureSet(&local_15c,0x4000);
    HeapType::HeapType(&local_170,string);
    Type::Type(&local_168,local_170,Nullable,Inexact);
    HeapType::HeapType(&local_180,string);
    Type::Type(&local_178,local_180,NonNullable,Inexact);
    pFVar3 = Random::FeatureOptions<wasm::Type>::add<wasm::Type>
                       (pFVar3,local_15c,local_168,local_178);
    this_local = (TranslateToFuzzReader *)pick<wasm::Type>(this,pFVar3);
    Random::FeatureOptions<wasm::Type>::~FeatureOptions(&local_88);
  }
  else {
    pvVar2 = pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                       (this,&this->interestingHeapTypes);
    HStack_40.id = pvVar2->id;
    local_44 = getNullability(this);
    local_50 = HStack_40.id;
    Type::Type((Type *)&this_local,HStack_40,local_44,Inexact);
  }
  return (Type)(uintptr_t)this_local;
}

Assistant:

Type TranslateToFuzzReader::getReferenceType() {
  if (wasm.features.hasReferenceTypes() && !interestingHeapTypes.empty() &&
      oneIn(2)) {
    auto heapType = pick(interestingHeapTypes);
    auto nullability = getNullability();
    return Type(heapType, nullability);
  }
  return pick(FeatureOptions<Type>()
                // TODO: Add externref here.
                .add(FeatureSet::ReferenceTypes, Type(HeapType::func, Nullable))
                .add(FeatureSet::ReferenceTypes | FeatureSet::GC,
                     Type(HeapType::func, NonNullable),
                     Type(HeapType::any, NonNullable),
                     Type(HeapType::eq, Nullable),
                     Type(HeapType::eq, NonNullable),
                     Type(HeapType::i31, Nullable),
                     Type(HeapType::i31, NonNullable),
                     Type(HeapType::struct_, Nullable),
                     Type(HeapType::struct_, NonNullable),
                     Type(HeapType::array, Nullable),
                     Type(HeapType::array, NonNullable))
                .add(FeatureSet::Strings,
                     Type(HeapType::string, Nullable),
                     Type(HeapType::string, NonNullable)));
}